

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,InterpolateBoundary v)

{
  int iVar1;
  InterpolateBoundary v_local;
  string *s;
  
  iVar1 = (int)this;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (iVar1 == 0) {
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"none");
  }
  else if (iVar1 == 1) {
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"edgeAndCorner");
  }
  else if (iVar1 == 2) {
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"edgeOnly");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tinyusdz::GeomMesh::InterpolateBoundary v) {
  std::string s;

  switch (v) {
    case tinyusdz::GeomMesh::InterpolateBoundary::InterpolateBoundaryNone: {
      s = "none";
      break;
    }
    case tinyusdz::GeomMesh::InterpolateBoundary::EdgeAndCorner: {
      s = "edgeAndCorner";
      break;
    }
    case tinyusdz::GeomMesh::InterpolateBoundary::EdgeOnly: {
      s = "edgeOnly";
      break;
    }
  }

  return s;
}